

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::blueprint_helpers::generateIncrementOption
               (double increment,int32_t trailingZeros,UnicodeString *sb,UErrorCode *param_4)

{
  UnicodeString local_a8;
  DecimalQuantity dq;
  
  DecimalQuantity::DecimalQuantity(&dq);
  DecimalQuantity::setToDouble(&dq,increment);
  DecimalQuantity::roundToInfinity(&dq);
  DecimalQuantity::toPlainString(&local_a8,&dq);
  icu_63::UnicodeString::append(sb,&local_a8);
  icu_63::UnicodeString::~UnicodeString(&local_a8);
  if (0 < trailingZeros) {
    anon_unknown.dwarf_1c0d33::appendMultiple(sb,0x30,trailingZeros);
  }
  DecimalQuantity::~DecimalQuantity(&dq);
  return;
}

Assistant:

void blueprint_helpers::generateIncrementOption(double increment, int32_t trailingZeros, UnicodeString& sb,
                                                UErrorCode&) {
    // Utilize DecimalQuantity/double_conversion to format this for us.
    DecimalQuantity dq;
    dq.setToDouble(increment);
    dq.roundToInfinity();
    sb.append(dq.toPlainString());

    // We might need to append extra trailing zeros for min fraction...
    if (trailingZeros > 0) {
        appendMultiple(sb, u'0', trailingZeros);
    }
}